

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::setEncoding(XMLReader *this,XMLCh *newEncoding)

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  MemoryManager *pMVar4;
  bool bVar5;
  int iVar6;
  Encodings encodingEnum;
  undefined4 extraout_var;
  long lVar8;
  short *psVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLTranscoder *pXVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TranscodingException *this_00;
  XMLCh *pXVar12;
  undefined2 *__src;
  size_t sVar13;
  Codes failReason_1;
  Codes failReason;
  Codes local_30;
  Codes local_2c;
  XMLCh *pXVar7;
  
  if (this->fForcedEncoding != false) {
    return true;
  }
  if (newEncoding == (XMLCh *)0x0) {
    pXVar7 = (XMLCh *)0x0;
  }
  else {
    sVar13 = 0;
    do {
      psVar9 = (short *)((long)newEncoding + sVar13);
      sVar13 = sVar13 + 2;
    } while (*psVar9 != 0);
    iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar13);
    pXVar7 = (XMLCh *)CONCAT44(extraout_var,iVar6);
    memcpy(pXVar7,newEncoding,sVar13);
  }
  XMLString::upperCaseASCII(pXVar7);
  if (pXVar7 == L"UTF-16") {
LAB_002c5d44:
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar7);
    encodingEnum = this->fEncoding;
    if (1 < encodingEnum - UTF_16B) {
      return false;
    }
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
    this->fEncodingStr = (XMLCh *)0x0;
    pMVar4 = this->fMemoryManager;
    sVar13 = 0;
    if (encodingEnum == UTF_16L) {
      do {
        psVar9 = (short *)((long)&XMLUni::fgUTF16LEncodingString + sVar13);
        sVar13 = sVar13 + 2;
      } while (*psVar9 != 0);
      iVar6 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,sVar13);
      memcpy((XMLCh *)CONCAT44(extraout_var_00,iVar6),&XMLUni::fgUTF16LEncodingString,sVar13);
      this->fEncodingStr = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
      encodingEnum = UTF_16L;
    }
    else {
      do {
        psVar9 = (short *)((long)&XMLUni::fgUTF16BEncodingString + sVar13);
        sVar13 = sVar13 + 2;
      } while (*psVar9 != 0);
      iVar6 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,sVar13);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
      __src = &XMLUni::fgUTF16BEncodingString;
LAB_002c5dfd:
      memcpy(pXVar7,__src,sVar13);
      this->fEncodingStr = pXVar7;
    }
  }
  else {
    if (pXVar7 == (XMLCh *)0x0) {
      psVar9 = &XMLUni::fgUTF16EncodingString;
LAB_002c5bd1:
      if ((pXVar7 != L"UCS2") && (*psVar9 != 0)) goto LAB_002c5be8;
      goto LAB_002c5d44;
    }
    lVar8 = 0;
    do {
      psVar9 = (short *)((long)pXVar7 + lVar8);
      if (*psVar9 == 0) {
        psVar9 = (short *)((long)&XMLUni::fgUTF16EncodingString + lVar8);
        goto LAB_002c5bd1;
      }
      psVar1 = (short *)((long)&XMLUni::fgUTF16EncodingString + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar9 == *psVar1);
    if (pXVar7 == L"UCS2") goto LAB_002c5d44;
LAB_002c5be8:
    if (pXVar7 == (XMLCh *)0x0) {
      psVar9 = &XMLUni::fgUTF16EncodingString2;
LAB_002c5c2b:
      if ((pXVar7 != L"IBM1200") && (*psVar9 != 0)) goto LAB_002c5c42;
      goto LAB_002c5d44;
    }
    lVar8 = 0;
    do {
      psVar9 = (short *)((long)pXVar7 + lVar8);
      if (*psVar9 == 0) {
        psVar9 = (short *)((long)&XMLUni::fgUTF16EncodingString2 + lVar8);
        goto LAB_002c5c2b;
      }
      psVar1 = (short *)((long)&XMLUni::fgUTF16EncodingString2 + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar9 == *psVar1);
    if (pXVar7 == L"IBM1200") goto LAB_002c5d44;
LAB_002c5c42:
    if (pXVar7 == (XMLCh *)0x0) {
      psVar9 = &XMLUni::fgUTF16EncodingString3;
LAB_002c5c85:
      if ((pXVar7 != L"IBM-1200") && (*psVar9 != 0)) goto LAB_002c5c9c;
      goto LAB_002c5d44;
    }
    lVar8 = 0;
    do {
      psVar9 = (short *)((long)pXVar7 + lVar8);
      if (*psVar9 == 0) {
        psVar9 = (short *)((long)&XMLUni::fgUTF16EncodingString3 + lVar8);
        goto LAB_002c5c85;
      }
      psVar1 = (short *)((long)&XMLUni::fgUTF16EncodingString3 + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar9 == *psVar1);
    if (pXVar7 == L"IBM-1200") goto LAB_002c5d44;
LAB_002c5c9c:
    if (pXVar7 == (XMLCh *)0x0) {
      psVar9 = &XMLUni::fgUTF16EncodingString4;
LAB_002c5cdc:
      if ((pXVar7 != L"UTF16") && (*psVar9 != 0)) goto LAB_002c5ceb;
      goto LAB_002c5d44;
    }
    lVar8 = 0;
    do {
      psVar9 = (short *)((long)pXVar7 + lVar8);
      if (*psVar9 == 0) {
        psVar9 = (short *)((long)&XMLUni::fgUTF16EncodingString4 + lVar8);
        goto LAB_002c5cdc;
      }
      psVar1 = (short *)((long)&XMLUni::fgUTF16EncodingString4 + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar9 == *psVar1);
    if (pXVar7 == L"UTF16") goto LAB_002c5d44;
LAB_002c5ceb:
    pXVar10 = L"UTF16";
    pXVar12 = pXVar7;
    if (pXVar7 == (XMLCh *)0x0) {
LAB_002c5d14:
      if (*pXVar10 == L'\0') goto LAB_002c5d44;
    }
    else {
      do {
        XVar2 = *pXVar12;
        if (XVar2 == L'\0') goto LAB_002c5d14;
        XVar3 = *pXVar10;
        pXVar10 = pXVar10 + 1;
        pXVar12 = pXVar12 + 1;
      } while (XVar2 == XVar3);
    }
    bVar5 = XMLString::equals(pXVar7,L"UCS-2");
    if ((bVar5) || (bVar5 = XMLString::equals(pXVar7,L"ISO-10646-UCS-2"), bVar5)) goto LAB_002c5d44;
    bVar5 = XMLString::equals(pXVar7,L"UCS4");
    if ((((bVar5) || (bVar5 = XMLString::equals(pXVar7,L"UCS-4"), bVar5)) ||
        (bVar5 = XMLString::equals(pXVar7,L"UCS_4"), bVar5)) ||
       ((bVar5 = XMLString::equals(pXVar7,L"UTF-32"), bVar5 ||
        (bVar5 = XMLString::equals(pXVar7,L"ISO-10646-UCS-4"), bVar5)))) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar7);
      encodingEnum = this->fEncoding;
      if (1 < encodingEnum - UCS_4B) {
        return false;
      }
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
      this->fEncodingStr = (XMLCh *)0x0;
      pMVar4 = this->fMemoryManager;
      sVar13 = 0;
      if (encodingEnum == UCS_4L) {
        do {
          psVar9 = (short *)((long)&XMLUni::fgUCS4LEncodingString + sVar13);
          sVar13 = sVar13 + 2;
        } while (*psVar9 != 0);
        iVar6 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,sVar13);
        memcpy((XMLCh *)CONCAT44(extraout_var_02,iVar6),&XMLUni::fgUCS4LEncodingString,sVar13);
        this->fEncodingStr = (XMLCh *)CONCAT44(extraout_var_02,iVar6);
        encodingEnum = UCS_4L;
        goto LAB_002c5e0f;
      }
      do {
        psVar9 = (short *)((long)&XMLUni::fgUCS4BEncodingString + sVar13);
        sVar13 = sVar13 + 2;
      } while (*psVar9 != 0);
      iVar6 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,sVar13);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_03,iVar6);
      __src = &XMLUni::fgUCS4BEncodingString;
      goto LAB_002c5dfd;
    }
    encodingEnum = XMLRecognizer::encodingForName(pXVar7);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
    this->fEncodingStr = pXVar7;
    if (encodingEnum == OtherEncoding) {
      if (this->fTranscoder != (XMLTranscoder *)0x0) {
        (*this->fTranscoder->_vptr_XMLTranscoder[1])();
        this->fTranscoder = (XMLTranscoder *)0x0;
      }
      pXVar11 = XMLTransService::makeNewTranscoderFor
                          (XMLPlatformUtils::fgTransService,this->fEncodingStr,&local_2c,0x4000,
                           this->fMemoryManager);
      this->fTranscoder = pXVar11;
      if (pXVar11 == (XMLTranscoder *)0x0) {
        this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x598,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        goto LAB_002c605a;
      }
      encodingEnum = OtherEncoding;
    }
  }
LAB_002c5e0f:
  if (this->fTranscoder == (XMLTranscoder *)0x0) {
    pXVar11 = XMLTransService::makeNewTranscoderFor
                        (XMLPlatformUtils::fgTransService,encodingEnum,&local_30,0x4000,
                         this->fMemoryManager);
    this->fTranscoder = pXVar11;
    if (pXVar11 == (XMLTranscoder *)0x0) {
      this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
      TranscodingException::TranscodingException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                 ,0x5b2,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
LAB_002c605a:
      __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
    }
  }
  this->fEncoding = encodingEnum;
  return true;
}

Assistant:

bool XMLReader::setEncoding(const XMLCh* const newEncoding)
{
    //
    //  If the encoding was forced, then we ignore the new value and just
    //  return with success. If it was forced, then we are to use that
    //  encoding without question. Note that, if we are forced, we created
    //  a transcoder up front so there is no need to do one here in that
    //  case.
    //
    if (fForcedEncoding)
        return true;

    //
    // upperCase the newEncoding first for better performance
    //
    XMLCh* inputEncoding = XMLString::replicate(newEncoding, fMemoryManager);
    XMLString::upperCaseASCII(inputEncoding);

    XMLRecognizer::Encodings newBaseEncoding;
    //
    //  Check for non-endian specific UTF-16 or UCS-4. If so, and if we
    //  are already in one of the endian versions of those encodings,
    //  then just keep it and go on. Otherwise, its not valid.
    //
    if (XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString2)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString3)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString4)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString5)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString6)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString7))
    {
        fMemoryManager->deallocate(inputEncoding);

        if ((fEncoding != XMLRecognizer::UTF_16L)
        &&  (fEncoding != XMLRecognizer::UTF_16B))
        {
            return false;
        }

        // Override with the original endian specific encoding
        newBaseEncoding = fEncoding;

        if (fEncoding == XMLRecognizer::UTF_16L) {
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUTF16LEncodingString, fMemoryManager);
        }
        else {
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUTF16BEncodingString, fMemoryManager);
        }
    }
    else if (XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString2)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString3)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString4)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString5))
    {
        fMemoryManager->deallocate(inputEncoding);

        if ((fEncoding != XMLRecognizer::UCS_4L)
        &&  (fEncoding != XMLRecognizer::UCS_4B))
        {
            return false;
        }

        // Override with the original endian specific encoding
        newBaseEncoding = fEncoding;

        if (fEncoding == XMLRecognizer::UCS_4L) {

            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUCS4LEncodingString, fMemoryManager);
        }
        else {

            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUCS4BEncodingString, fMemoryManager);
        }
    }
     else
    {
        //
        //  Try to map the string to one of our standard encodings. If its not
        //  one of them, then it has to be one of the non-intrinsic encodings,
        //  in which case we have to delete our intrinsic encoder and create a
        //  new one.
        //
        newBaseEncoding = XMLRecognizer::encodingForName(inputEncoding);

        //
        //  If it does not come back as one of the auto-sensed encodings, then we
        //  have to possibly replace it and at least check a few things.
        //
        if (newBaseEncoding == XMLRecognizer::OtherEncoding)
        {
            //
            // We already know it's none of those non-endian special cases,
            // so just replicate the new name and use it directly to create the transcoder
            //
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = inputEncoding;

            // Check for a pre-created transcoder to delete.
            if (fTranscoder) {
                delete fTranscoder;
                fTranscoder = 0;
            }

            XMLTransService::Codes failReason;
            fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
            (
                fEncodingStr
                , failReason
                , kCharBufSize
                , fMemoryManager
            );

            if (!fTranscoder)
                ThrowXMLwithMemMgr1(TranscodingException, XMLExcepts::Trans_CantCreateCvtrFor, fEncodingStr, fMemoryManager);
        }
        else
        {
            // Store the new encoding string since it is just an intrinsic
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = inputEncoding;
        }
    }

    if (!fTranscoder) {
        //
        //  Now we can create a transcoder using the recognized fEncoding.  We
        //  might get back a transcoder for an intrinsically supported encoding,
        //  or we might get one from the underlying transcoding service.
        //
        XMLTransService::Codes failReason;
        fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
        (
            newBaseEncoding
            , failReason
            , kCharBufSize
            , fMemoryManager
        );

        if (!fTranscoder)
            ThrowXMLwithMemMgr1(TranscodingException, XMLExcepts::Trans_CantCreateCvtrFor, fEncodingStr, fMemoryManager);
    }

    // Update the base encoding member with the new base encoding found
    fEncoding = newBaseEncoding;

    // Looks ok to us
    return true;
}